

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# umutablecptrie.cpp
# Opt level: O1

int32_t __thiscall
icu_63::anon_unknown_0::MutableCodePointTrie::allocDataBlock
          (MutableCodePointTrie *this,int32_t blockLength)

{
  int iVar1;
  int iVar2;
  uint32_t *__src;
  uint32_t *__dest;
  int iVar3;
  int iVar4;
  
  iVar1 = this->dataCapacity;
  iVar2 = this->dataLength;
  iVar3 = blockLength + iVar2;
  if (iVar1 < iVar3) {
    iVar4 = 0x20000;
    if ((0x1ffff < iVar1) && (iVar4 = 0x110000, 0x10ffff < iVar1)) {
      return -1;
    }
    __dest = (uint32_t *)uprv_malloc_63((ulong)(uint)(iVar4 * 4));
    if (__dest == (uint32_t *)0x0) {
      return -1;
    }
    __src = this->data;
    memcpy(__dest,__src,(long)this->dataLength << 2);
    uprv_free_63(__src);
    this->data = __dest;
    this->dataCapacity = iVar4;
  }
  this->dataLength = iVar3;
  return iVar2;
}

Assistant:

int32_t MutableCodePointTrie::allocDataBlock(int32_t blockLength) {
    int32_t newBlock = dataLength;
    int32_t newTop = newBlock + blockLength;
    if (newTop > dataCapacity) {
        int32_t capacity;
        if (dataCapacity < MEDIUM_DATA_LENGTH) {
            capacity = MEDIUM_DATA_LENGTH;
        } else if (dataCapacity < MAX_DATA_LENGTH) {
            capacity = MAX_DATA_LENGTH;
        } else {
            // Should never occur.
            // Either MAX_DATA_LENGTH is incorrect,
            // or the code writes more values than should be possible.
            return -1;
        }
        uint32_t *newData = (uint32_t *)uprv_malloc(capacity * 4);
        if (newData == nullptr) {
            return -1;
        }
        uprv_memcpy(newData, data, (size_t)dataLength * 4);
        uprv_free(data);
        data = newData;
        dataCapacity = capacity;
    }
    dataLength = newTop;
    return newBlock;
}